

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

int __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::shutdown(ConnectionImpl *this,int __fd,int __how)

{
  ConnectionImpl *pCVar1;
  PromiseArena *pPVar2;
  SourceLocation location;
  Connection CVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:461:30)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1e0;
  anon_class_8_1_8991fb9c_for_func local_1d8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1d0;
  code *local_1c8;
  Connection local_1c0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1b8;
  Exception local_1b0;
  
  local_1d8.this = (ConnectionImpl *)CONCAT44(in_register_00000034,__fd);
  if (((local_1d8.this)->vat->shutdownExceptionToThrow).ptr.isSet == true) {
    kj::Exception::Exception
              (&local_1b0,&((local_1d8.this)->vat->shutdownExceptionToThrow).ptr.field_1.value);
    kj::Promise<void>::Promise((Promise<void> *)this,&local_1b0);
    kj::Exception::~Exception(&local_1b0);
  }
  else {
    pCVar1 = ((local_1d8.this)->partner).ptr;
    if ((pCVar1 == (ConnectionImpl *)0x0) || (pCVar1->initiatedIdleShutdown == true)) {
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
    else {
      kj::yield();
      local_1c8 = kj::_::
                  SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:461:30)>
                  ::anon_class_8_1_8991fb9c_for_func::operator();
      pPVar2 = ((local_1e0.ptr)->super_PromiseArenaMember).arena;
      if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_1e0.ptr - (long)pPVar2) < 0x28) {
        pvVar4 = operator_new(0x400);
        location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:461:30)>
                       *)((long)pvVar4 + 0x3d8);
        kj::
        ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::shutdown()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::shutdown()::_lambda()_1_,void*&>
                  (location_00,&local_1e0,&local_1d8,&local_1c8);
        *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
      }
      else {
        ((local_1e0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
        location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:461:30)>
                       *)&local_1e0.ptr[-3].super_PromiseArenaMember.arena;
        kj::
        ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::shutdown()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::shutdown()::_lambda()_1_,void*&>
                  (location_00,&local_1e0,&local_1d8,&local_1c8);
        local_1e0.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
      }
      local_1b0.ownFile.content.ptr =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
      ;
      local_1b0.ownFile.content.size_ = (size_t)&DAT_0042a1d1;
      local_1b0.ownFile.content.disposer = (ArrayDisposer *)0x4c0000058b;
      location.function = &DAT_0042a1d1;
      location.fileName = &DAT_0042a172;
      location.lineNumber = 0x58b;
      location.columnNumber = 0x4c;
      local_1d0.ptr = (PromiseNode *)location_00;
      kj::_::maybeChain<void>((OwnPromiseNode *)&local_1c0,(Promise<void> *)&local_1d0,location);
      CVar3._vptr_Connection = local_1c0._vptr_Connection;
      local_1c0._vptr_Connection = (_func_int **)0x0;
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1c0);
      (this->super_Connection).super_Connection._vptr_Connection = CVar3._vptr_Connection;
      local_1b8.ptr = (PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1b8);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1d0);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1e0);
    }
  }
  return (int)this;
}

Assistant:

kj::Promise<void> shutdown() override {
      KJ_IF_SOME(e, vat.shutdownExceptionToThrow) {
        return kj::cp(e);
      }
      KJ_IF_SOME(p, partner) {
        if (p.initiatedIdleShutdown) {
          // Partner already initiated shutdown so don't wait for it to call
          // receiveIncomingMessage() again (it won't).
          return kj::READY_NOW;
        }

        // Make sure partner receives EOF. We have to evalLater() because
        // OutgoingMessageImpl::send() also does that and we need to deliver in order.
        return kj::evalLater([this]() -> kj::Promise<void> {
          KJ_IF_SOME(p, partner) {
            p.messageQueue.push(kj::none);
            auto paf = kj::newPromiseAndFulfiller<void>();
            p.fulfillOnEnd = kj::mv(paf.fulfiller);
            return kj::mv(paf.promise);
          } else {
            return kj::READY_NOW;
          }
        });
      } else {
        return kj::READY_NOW;
      }
    }